

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::clearConnections(QColumnViewPrivate *this)

{
  pointer pCVar1;
  ulong uVar2;
  Connection *connection;
  pointer pCVar3;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  copy;
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::disconnect(&this->animationConnection);
  pCVar1 = (this->gripConnections).
           super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->gripConnections).
                super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    QObject::disconnect(pCVar3);
  }
  local_28.d = (this->viewConnections).d;
  if ((local_28.d != (Data *)0x0) &&
     (((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_28.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_28.d == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else {
    pDVar4 = local_28.d;
    if ((local_28.d)->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if ((local_28.d)->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while ((local_28.d)->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_0056ad44;
    }
  }
  uVar5 = 0;
LAB_0056ad44:
  if (pDVar4 != (Data *)0x0 || uVar5 != 0) {
    do {
      disconnectView(this,*(QAbstractItemView **)
                           pDVar4->spans[uVar5 >> 7].entries
                           [pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data);
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar4 != (Data *)0x0) || (uVar5 != 0));
  }
  QHash<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>
  ::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::clearConnections()
{
#if QT_CONFIG(animation)
    QObject::disconnect(animationConnection);
#endif
    for (const QMetaObject::Connection &connection : gripConnections)
        QObject::disconnect(connection);
    const auto copy = viewConnections;  // disconnectView modifies this container
    for (auto it = copy.keyBegin(); it != copy.keyEnd(); ++it)
        disconnectView(*it);
}